

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

Result __thiscall
testing::Action<const_solitaire::interfaces::Solitaire_&()>::Perform
          (Action<const_solitaire::interfaces::Solitaire_&()> *this)

{
  bool bVar1;
  Solitaire *pSVar2;
  Action<const_solitaire::interfaces::Solitaire_&()> *this_local;
  
  bVar1 = IsDoDefault(this);
  if (bVar1) {
    internal::IllegalDoDefault
              ("/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/externalLibs/googletest/googlemock/include/gmock/gmock-actions.h"
               ,0x1f0);
  }
  pSVar2 = internal::
           Apply<std::function<solitaire::interfaces::Solitaire_const&()>const&,std::tuple<>>
                     (&this->fun_,(tuple<> *)((long)&this_local + 7));
  return pSVar2;
}

Assistant:

Result Perform(ArgumentTuple args) const {
    if (IsDoDefault()) {
      internal::IllegalDoDefault(__FILE__, __LINE__);
    }
    return internal::Apply(fun_, ::std::move(args));
  }